

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::gather_grid(RTCGeometry geom,avector<Vec3fa> *positions,size_t width,size_t height,
                        uint *indices,avector<Vec3fa> *vertices,uint edgey)

{
  float *pfVar1;
  Vec3fa *pVVar2;
  Vec3fa *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined4 uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  ulong local_78;
  long local_58;
  
  if (height != 0) {
    local_58 = 0;
    local_78 = 0;
    do {
      uVar8 = edgey;
      if (width != 0) {
        lVar11 = local_58;
        uVar12 = 1;
        do {
          pVVar3 = vertices->items + indices[uVar8];
          fVar4 = (pVVar3->field_0).m128[1];
          fVar5 = (pVVar3->field_0).m128[2];
          fVar6 = (pVVar3->field_0).m128[3];
          pfVar1 = (float *)((long)&positions->items->field_0 + lVar11);
          *pfVar1 = (pVVar3->field_0).m128[0];
          pfVar1[1] = fVar4;
          pfVar1[2] = fVar5;
          pfVar1[3] = fVar6;
          uVar8 = rtcGetGeometryPreviousHalfEdge(geom,uVar8);
          if (uVar12 < width) {
            uVar9 = rtcGetGeometryPreviousHalfEdge(geom,uVar8);
            uVar8 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar9);
          }
          lVar11 = lVar11 + 0x10;
          bVar13 = uVar12 != width;
          uVar12 = uVar12 + 1;
        } while (bVar13);
      }
      pVVar3 = vertices->items + indices[uVar8];
      fVar4 = (pVVar3->field_0).m128[1];
      fVar5 = (pVVar3->field_0).m128[2];
      fVar6 = (pVVar3->field_0).m128[3];
      pVVar2 = positions->items + local_78 * (width + 1) + width;
      (pVVar2->field_0).m128[0] = (pVVar3->field_0).m128[0];
      (pVVar2->field_0).m128[1] = fVar4;
      (pVVar2->field_0).m128[2] = fVar5;
      (pVVar2->field_0).m128[3] = fVar6;
      edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      local_78 = local_78 + 1;
      if (local_78 < height) {
        uVar9 = rtcGetGeometryOppositeHalfEdge(geom,0,edgey);
        edgey = rtcGetGeometryNextHalfEdge(geom,uVar9);
      }
      local_58 = local_58 + width * 0x10 + 0x10;
    } while (local_78 != height);
  }
  if (width == 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = width + 1;
    lVar10 = height * lVar11 * 0x10;
    uVar12 = 1;
    do {
      pVVar3 = vertices->items + indices[edgey];
      fVar4 = (pVVar3->field_0).m128[1];
      fVar5 = (pVVar3->field_0).m128[2];
      fVar6 = (pVVar3->field_0).m128[3];
      pfVar1 = (float *)((long)&positions->items->field_0 + lVar10);
      *pfVar1 = (pVVar3->field_0).m128[0];
      pfVar1[1] = fVar4;
      pfVar1[2] = fVar5;
      pfVar1[3] = fVar6;
      edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      if (uVar12 < width) {
        uVar9 = rtcGetGeometryOppositeHalfEdge(geom,0,edgey);
        edgey = rtcGetGeometryNextHalfEdge(geom,uVar9);
      }
      lVar10 = lVar10 + 0x10;
      bVar13 = uVar12 != width;
      uVar12 = uVar12 + 1;
    } while (bVar13);
  }
  pVVar3 = positions->items;
  uVar7 = *(undefined8 *)((long)&vertices->items[indices[edgey]].field_0 + 8);
  *(undefined8 *)&pVVar3[lVar11 * height + width].field_0 =
       *(undefined8 *)&vertices->items[indices[edgey]].field_0;
  *(undefined8 *)((long)&pVVar3[lVar11 * height + width].field_0 + 8) = uVar7;
  return;
}

Assistant:

void gather_grid(RTCGeometry geom, avector<Vec3fa>& positions, size_t width, size_t height, unsigned int* indices, avector<Vec3fa>& vertices, unsigned int edgey)
  {
    //        
    // | <----------    <----------
    // |            /\ |           /\ .
    // | edgey       | |           |
    // |             | |           |
    // \/            | \/          |
    
    /* gather all rows */
    size_t y=0;
    for (; y<height; y++)
    {
      /* here edgey points from top/left vertex downwards */
      unsigned int edgex = edgey;

      /* gather all columns */
      size_t x=0;
      for (; x<width; x++)
      {
        /* here edgex points from left vertex of row downwards */
        positions[y*(width+1)+x] = vertices[indices[edgex]];

        /* prev -> prev -> opposite moves to the next column (unless we reach the right end) */
        edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
        if (x+1 < width) {
          edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
          edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        }
      }
      /* load rightmost vertex */
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to next row (unless we reach the bottom) */
      edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      if (y+1 < height) {
        edgey = rtcGetGeometryOppositeHalfEdge(geom,0,edgey);
        edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      }
    }

    /* special treatment for last row, edgy points from the bottom/left vertex to the right */
    unsigned int edgex = edgey;
    for (size_t x=0; x<width; x++)
    {
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to the next column (unless we reach the right end) */
      edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      if (x+1 < width) {
        edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      }
    }
    /* load rightmost vertex */
    positions[height*(width+1)+width] = vertices[indices[edgex]];
  }